

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hextile.hpp
# Opt level: O3

void __thiscall
hextile::HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_>::__introspect
          (HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_> *this,size_t off)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)off);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"HexTile[",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (this->_y * this->_x != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      gamespace::BoardTile::__introspect
                ((BoardTile *)
                 ((long)((((this->_data).
                           super__Vector_base<gamespace::BoardTile,_std::allocator<gamespace::BoardTile>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_marker_layer)._M_elems +
                        0xfffffffffffffffd) + lVar3),off + 2);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x80;
    } while (uVar2 < this->_y * this->_x);
  }
  return;
}

Assistant:

void __introspect(size_t off) {
            std::cout << std::string(off, ' ') << "HexTile[" << _x << "," << _y << "]" << std::endl;
            for(size_t i = 0; i < _x * _y; ++i)
                _data[i].__introspect(off + 2);
        }